

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::remapIds
          (TIntermediate *this,TIdMaps *idMaps,longlong idShift,TIntermediate *unit)

{
  TRemapIdTraverser TStack_58;
  
  TRemapIdTraverser::TRemapIdTraverser(&TStack_58,idMaps,idShift);
  (*unit->treeRoot->_vptr_TIntermNode[2])(unit->treeRoot,&TStack_58);
  return;
}

Assistant:

void TIntermediate::remapIds(const TIdMaps& idMaps, long long idShift, TIntermediate& unit)
{
    // Remap all IDs to either share or be unique, as dictated by the idMap and idShift.
    TRemapIdTraverser idTraverser(idMaps, idShift);
    unit.getTreeRoot()->traverse(&idTraverser);
}